

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# newtonmin.c
# Opt level: O1

int trupdate(custom_function *funcpt,double *xi,double *jac,double *step,int N,double *dx,
            double maxstep,int retcode,double *L,double *hess,double stol,int method,double *ioval,
            double *xprev,double *funcprev,double *x)

{
  double dVar1;
  double dVar2;
  double *C;
  double *array;
  ulong uVar3;
  ulong uVar4;
  char *pcVar5;
  ulong uVar6;
  double *pdVar7;
  ulong uVar8;
  double *pdVar9;
  int iVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  
  dVar1 = *ioval;
  C = (double *)malloc(8);
  array = (double *)malloc((long)N * 8);
  dVar11 = 0.0;
  if (0 < N) {
    uVar3 = 0;
    do {
      dVar11 = dVar11 + dx[uVar3] * step[uVar3] * dx[uVar3] * step[uVar3];
      uVar3 = uVar3 + 1;
    } while ((uint)N != uVar3);
  }
  if (dVar11 < 0.0) {
    dVar11 = sqrt(dVar11);
  }
  else {
    dVar11 = SQRT(dVar11);
  }
  dVar12 = (*funcpt->funcpt)(xi,N,funcpt->params);
  if (1.79769313486232e+308 <= ABS(dVar12)) {
    pcVar5 = "Program Exiting as the function value exceeds the maximum double value";
LAB_00127767:
    printf(pcVar5);
    iVar10 = 0xf;
    goto LAB_001277ea;
  }
  if (NAN(dVar12)) {
    pcVar5 = "Program Exiting as the function returns NaN";
  }
  else {
    madd(xi,step,x,1,N);
    dVar13 = (*funcpt->funcpt)(x,N,funcpt->params);
    if (ABS(dVar13) < 1.79769313486232e+308) {
      if (NAN(dVar13)) {
        pcVar5 = "Program Exiting as the function returns NaN";
        goto LAB_00127767;
      }
      dVar12 = dVar13 - dVar12;
      mmult(jac,step,C,1,N,1);
      if (retcode != 3) {
        *funcprev = 0.0;
      }
      dVar2 = *C;
      if (dVar12 <= dVar2 * 0.0001) {
        if ((retcode != 3) || (dVar13 < *funcprev)) goto LAB_0012780c;
LAB_001277b0:
        if (0 < N) {
          uVar3 = 0;
          do {
            x[uVar3] = xprev[uVar3];
            uVar3 = uVar3 + 1;
          } while ((uint)N != uVar3);
        }
        iVar10 = 0;
        dVar14 = dVar1 * 0.5;
      }
      else {
        if (retcode == 3) goto LAB_001277b0;
LAB_0012780c:
        dVar14 = dVar1;
        if (dVar2 * 0.0001 <= dVar12) {
          if (0 < N) {
            uVar3 = 0;
            do {
              dVar13 = ABS(xi[uVar3]);
              if (ABS(xi[uVar3]) <= 1.0 / ABS(dx[uVar3])) {
                dVar13 = 1.0 / ABS(dx[uVar3]);
              }
              array[uVar3] = step[uVar3] / dVar13;
              uVar3 = uVar3 + 1;
            } while ((uint)N != uVar3);
          }
          dVar13 = array_max_abs(array,N);
          if (stol <= dVar13) {
            dVar11 = (-*C * dVar11) / ((dVar12 - dVar11) + (dVar12 - dVar11));
            iVar10 = 2;
            dVar14 = dVar1 * 0.1;
            if ((dVar1 * 0.1 <= dVar11) && (dVar14 = dVar1 * 0.5, dVar11 <= dVar1 * 0.5)) {
              dVar14 = dVar11;
            }
          }
          else {
            iVar10 = 1;
            if (0 < N) {
              uVar3 = 0;
              do {
                x[uVar3] = xi[uVar3];
                uVar3 = uVar3 + 1;
              } while ((uint)N != uVar3);
            }
          }
        }
        else {
          dVar11 = dVar2;
          if (method == 0) {
            if (0 < N) {
              uVar4 = (ulong)(uint)N;
              uVar6 = 0;
              uVar3 = uVar4;
              pdVar7 = step;
              pdVar9 = hess;
              do {
                dVar15 = step[uVar6];
                dVar16 = hess[uVar6 + (uint)((int)uVar6 * N)] * 0.5 * dVar15 * dVar15;
                uVar6 = uVar6 + 1;
                if (uVar6 < uVar4) {
                  uVar8 = 1;
                  do {
                    dVar16 = dVar16 + pdVar9[uVar8] * dVar15 * pdVar7[uVar8];
                    uVar8 = uVar8 + 1;
                  } while (uVar3 != uVar8);
                }
                dVar11 = dVar11 + dVar16;
                pdVar9 = pdVar9 + uVar4 + 1;
                pdVar7 = pdVar7 + 1;
                uVar3 = uVar3 - 1;
              } while (uVar6 != uVar4);
            }
          }
          else if ((method == 1) && (0 < N)) {
            uVar4 = (ulong)(uint)N;
            uVar6 = 0;
            uVar3 = uVar4;
            do {
              dVar15 = 0.0;
              uVar8 = 0;
              pdVar7 = L;
              do {
                dVar15 = dVar15 + *pdVar7 * step[uVar8];
                pdVar7 = pdVar7 + uVar4;
                uVar8 = uVar8 + 1;
              } while (uVar3 != uVar8);
              dVar11 = dVar11 + dVar15 * dVar15 * 0.5;
              uVar6 = uVar6 + 1;
              L = L + uVar4 + 1;
              step = step + 1;
              uVar3 = uVar3 - 1;
            } while (uVar6 != uVar4);
          }
          if ((retcode == 2) ||
             ((((ABS(dVar12) < ABS(dVar11 - dVar12) && (dVar2 < dVar12)) || (ioval[6] != 0.0)) ||
              ((NAN(ioval[6]) || (maxstep * 0.99 < dVar1)))))) {
            if (dVar11 * 0.1 <= dVar12) {
              iVar10 = 0;
              dVar14 = dVar1 * 0.5;
            }
            else {
              iVar10 = 0;
              if ((dVar12 <= dVar11 * 0.75) && (dVar14 = dVar1 + dVar1, maxstep <= dVar1 + dVar1)) {
                dVar14 = maxstep;
              }
            }
          }
          else {
            *funcprev = dVar13;
            if (0 < N) {
              uVar3 = 0;
              do {
                xprev[uVar3] = x[uVar3];
                uVar3 = uVar3 + 1;
              } while ((uint)N != uVar3);
            }
            dVar14 = dVar1 + dVar1;
            if (maxstep <= dVar1 + dVar1) {
              dVar14 = maxstep;
            }
            iVar10 = 3;
          }
        }
      }
      *ioval = dVar14;
      goto LAB_001277ea;
    }
    pcVar5 = "Program Exiting as the function value exceeds the maximum double value";
  }
  printf(pcVar5);
  iVar10 = 0xf;
LAB_001277ea:
  free(array);
  free(C);
  return iVar10;
}

Assistant:

int trupdate(custom_function *funcpt,double *xi,double *jac,double *step,int N,double * dx,double maxstep,
		int retcode,double *L,double *hess,double stol,int method,double *ioval,double *xprev,double *funcprev,double *x) {
			
	int retval;	
	int i,j,c1;
	double delta,alpha,nlen,rell,den,deltatemp;
	double funci,funcf,df,dfp,temp;
	double *slopei,*rcheck;
	/*Return Codes
	 * 
	 * 0 - x Accepted.
	 * 1 - x unsatisfactory but (x-xi) is smaller than stopping criteria stol
	 * 2 - f(x) large. Reduce delta
	 * 3 - f(x) sufficiently small. Double delta
	 * 
	 */ 
	 
	alpha = 1.0e-04;
	delta = ioval[0];
	nlen = 0.0;
	 
	slopei = (double*) malloc(sizeof(double) *1);
	rcheck = (double*) malloc(sizeof(double) *N);
 
	for(i = 0; i < N;++i) {
		nlen += dx[i] * step[i] * dx[i] * step[i];
	}
	nlen = sqrt(nlen);
	
	
	funci = FUNCPT_EVAL(funcpt, xi, N);
	if (funci >= DBL_MAX || funci <= -DBL_MAX) {
		printf("Program Exiting as the function value exceeds the maximum double value");
		free(rcheck);
		free(slopei);
		return 15;
	}
	if (funci != funci) {
		printf("Program Exiting as the function returns NaN");
		free(rcheck);
		free(slopei);
		return 15;
	}
	
	madd(xi,step,x,1,N);
	
	funcf = FUNCPT_EVAL(funcpt, x, N);
	if (funcf >= DBL_MAX || funcf <= -DBL_MAX) {
		printf("Program Exiting as the function value exceeds the maximum double value");
		free(rcheck);
		free(slopei);
		return 15;
	}
	if (funcf != funcf) {
		printf("Program Exiting as the function returns NaN");
		free(rcheck);
		free(slopei);
		return 15;
	}
	
	df = funcf - funci;
	mmult(jac,step,slopei,1,N,1);
	 
	if (retcode != 3) {
		*funcprev = 0.;
	} 
	
	if ((df > alpha *slopei[0] || funcf >= *funcprev) && retcode == 3) {
		for(i = 0;i < N;++i) {
			x[i] = xprev[i];
		}
		retval = 0;
		funcf = *funcprev;
		delta /= 2.0;
	} else if (df >= alpha *slopei[0]) {
		for(i = 0; i < N;++i) {
			if (fabs(xi[i]) > 1.0 /fabs(dx[i])) {
				den = fabs(xi[i]);
			} else {
				den = 1.0 /fabs(dx[i]);
			}
			rcheck[i] = step[i]/den;
		}
	
		rell = array_max_abs(rcheck,N);
		
		if (rell < stol) {
			retval = 1;
			for(i = 0; i < N;++i) {
				x[i] = xi[i];
			}
		} else {
			retval = 2;
			deltatemp = - slopei[0] * nlen /(2*(df - nlen));
			if (deltatemp < 0.1 * delta) {
				delta *= 0.1;
			} else if (deltatemp > 0.5 * delta) {
				delta *= 0.5;
			} else {
				delta = deltatemp;
			}
		}
		
	} else {
		dfp = slopei[0];
		if (method == 0) {
			for (i = 0;i < N;++i) {
				//Hook
				c1 = i * N;
				temp = 0.5 * hess[c1+i] * step[i] * step[i];
				for (j = i+1; j < N;++j) {
					temp += hess[c1+j] * step[i] * step[j];
				}
				dfp += temp;
			}
		} else if (method == 1) {
			//Double Dogleg
			for (i = 0; i < N;++i) {
				temp = 0.0;
				for(j = i; j < N;++j) {
					temp += L[j*N+i] * step[j];
				}
				dfp += temp*temp/2.0;
			}
		}
		
		if ((retcode != 2) && (fabs(dfp - df) <= fabs(df) || df <= slopei[0]) && (ioval[6] == 0.0) && (delta <= 0.99*maxstep)) {
			retval = 3;
			*funcprev = funcf;
			for(i = 0; i < N;++i) {
				xprev[i] = x[i];
			}
			if (maxstep > 2*delta) {
				delta = 2 * delta;
			} else {
				delta = maxstep;
			}
			
		} else {
			retval = 0;
			if (df >= 0.1 * dfp) {
				delta = delta/2;
			} else if (df <= 0.75 *dfp) {
				if (maxstep > 2*delta) {
				delta = 2 * delta;
				} else {
					delta = maxstep;
				}
				
			}
		}
	}
	
	
	ioval[0] = delta;
	free(rcheck);
	free(slopei); 
	return retval;
		
}